

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void pshufw_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
      failDecode(pMyDisasm);
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      if (((pMyDisasm->Reserved_).EVEX.state == '\x01') && ((pMyDisasm->Reserved_).EVEX.W == '\x01')
         ) {
        failDecode(pMyDisasm);
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vpshufd");
        vex_GxEx(pMyDisasm);
        getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
        verifyVEXvvvv(pMyDisasm);
      }
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x02') {
      strcpy((pMyDisasm->Instruction).Mnemonic,"vpshufhw");
      vex_GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
      verifyVEXvvvv(pMyDisasm);
    }
    else {
      strcpy((pMyDisasm->Instruction).Mnemonic,"vpshuflw");
      vex_GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
      verifyVEXvvvv(pMyDisasm);
    }
  }
  else {
    (pMyDisasm->Instruction).Category = 0x50017;
    if ((pMyDisasm->Reserved_).PrefRepe == 1) {
      (pMyDisasm->Prefix).RepPrefix = '\b';
      strcpy((pMyDisasm->Instruction).Mnemonic,"pshufhw");
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
    }
    else if ((pMyDisasm->Reserved_).PrefRepne == 1) {
      (pMyDisasm->Prefix).RepnePrefix = '\b';
      strcpy((pMyDisasm->Instruction).Mnemonic,"pshuflw");
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
    }
    else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      strcpy((pMyDisasm->Instruction).Mnemonic,"pshufd");
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
    }
    else {
      strcpy((pMyDisasm->Instruction).Mnemonic,"pshufw");
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      (pMyDisasm->Reserved_).Register_ = 2;
      GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ pshufw_(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0) {
     failDecode(pMyDisasm);
   }
   else if (GV.VEX.pp == 1) {
     if (
         (GV.EVEX.state == InUsePrefix) &&
         (GV.EVEX.W == 1)
       ) {
       failDecode(pMyDisasm);
       return;
     }
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpshufd");
     #endif
     vex_GxEx(pMyDisasm);
     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
     verifyVEXvvvv(pMyDisasm);
   }
   else if (GV.VEX.pp == 2) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpshufhw");
     #endif
     vex_GxEx(pMyDisasm);
     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
     verifyVEXvvvv(pMyDisasm);
   }
   else {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpshuflw");
     #endif
     vex_GxEx(pMyDisasm);
     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
     verifyVEXvvvv(pMyDisasm);
   }
 }
 else {
   pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+SIMD128bits;
   /* ========= 0xf3 */
   if (GV.PrefRepe == 1) {
     pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;

     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pshufhw");
     #endif
     GV.MemDecoration = Arg2_m128_xmm;
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
   }
   /* ========= 0xf2 */
   else if (GV.PrefRepne == 1) {
     pMyDisasm->Prefix.RepnePrefix = MandatoryPrefix;

     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pshuflw");
     #endif
     GV.MemDecoration = Arg2_m128_xmm;
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
   }
   /* ========== 0x66 */
   else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
     GV.OperandSize = GV.OriginalOperandSize;
     pMyDisasm->Prefix.OperandSize = MandatoryPrefix;

     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pshufd");
     #endif
     GV.MemDecoration = Arg2_m128_xmm;
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
   }
   else {

     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pshufw");
     #endif
     GV.MemDecoration = Arg2qword;
     GV.Register_ = MMX_REG;
     GxEx(pMyDisasm);

     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
   }
 }
}